

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlNextChar(xmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  byte *pbVar2;
  int iVar3;
  xmlChar *pxVar4;
  char *msg;
  xmlParserInputPtr pxVar5;
  char buffer [150];
  xmlChar local_b8 [160];
  
  if (((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->instate != XML_PARSER_EOF)) &&
     (pxVar5 = ctxt->input, pxVar5 != (xmlParserInputPtr)0x0)) {
    if (pxVar5->end < pxVar5->cur) {
      xmlErrInternal(ctxt,"Parser input data memory error\n",(xmlChar *)0x0);
      ctxt->errNo = 1;
      xmlStopParser(ctxt);
      return;
    }
    if ((*pxVar5->cur != '\0') || (iVar3 = xmlParserInputGrow(pxVar5,0xfa), 0 < iVar3)) {
      pxVar5 = ctxt->input;
      pxVar4 = pxVar5->cur;
      if (ctxt->charset == 1) {
        if (*pxVar4 == '\n') {
          pxVar5->line = pxVar5->line + 1;
          pxVar5->col = 1;
        }
        else {
          pxVar5->col = pxVar5->col + 1;
        }
        if ((char)*pxVar4 < '\0') {
          if ((*pxVar4 != 0xc0) && (pxVar4[1] == '\0')) {
            xmlParserInputGrow(pxVar5,0xfa);
            pxVar5 = ctxt->input;
          }
          pbVar2 = pxVar5->cur;
          if ((long)pxVar5->end - (long)pbVar2 < 4) {
            msg = "Input is not proper UTF-8, indicate encoding !\n";
            pxVar4 = (xmlChar *)0x0;
          }
          else {
            pxVar4 = local_b8;
            snprintf((char *)pxVar4,0x95,"Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",(ulong)*pbVar2,
                     (ulong)pbVar2[1],(ulong)pbVar2[2],(uint)pbVar2[3]);
            msg = "Input is not proper UTF-8, indicate encoding !\n%s";
          }
          __xmlErrEncoding(ctxt,XML_ERR_INVALID_CHAR,msg,pxVar4,(xmlChar *)0x0);
          ctxt->charset = 10;
          ppxVar1 = &ctxt->input->cur;
          *ppxVar1 = *ppxVar1 + 1;
          return;
        }
      }
      else if (*pxVar4 == '\n') {
        pxVar5->line = pxVar5->line + 1;
        pxVar5->col = 1;
      }
      else {
        pxVar5->col = pxVar5->col + 1;
      }
      pxVar5->cur = pxVar4 + 1;
      if (*pxVar5->cur == '\0') {
        xmlParserInputGrow(pxVar5,0xfa);
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlNextChar(xmlParserCtxtPtr ctxt)
{
    if ((ctxt == NULL) || (ctxt->instate == XML_PARSER_EOF) ||
        (ctxt->input == NULL))
        return;

    if (!(VALID_CTXT(ctxt))) {
        xmlErrInternal(ctxt, "Parser input data memory error\n", NULL);
	ctxt->errNo = XML_ERR_INTERNAL_ERROR;
        xmlStopParser(ctxt);
	return;
    }

    if ((*ctxt->input->cur == 0) &&
        (xmlParserInputGrow(ctxt->input, INPUT_CHUNK) <= 0)) {
        return;
    }

    if (ctxt->charset == XML_CHAR_ENCODING_UTF8) {
        const unsigned char *cur;
        unsigned char c;

        /*
         *   2.11 End-of-Line Handling
         *   the literal two-character sequence "#xD#xA" or a standalone
         *   literal #xD, an XML processor must pass to the application
         *   the single character #xA.
         */
        if (*(ctxt->input->cur) == '\n') {
            ctxt->input->line++; ctxt->input->col = 1;
        } else
            ctxt->input->col++;

        /*
         * We are supposed to handle UTF8, check it's valid
         * From rfc2044: encoding of the Unicode values on UTF-8:
         *
         * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
         * 0000 0000-0000 007F   0xxxxxxx
         * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
         * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
         *
         * Check for the 0x110000 limit too
         */
        cur = ctxt->input->cur;

        c = *cur;
        if (c & 0x80) {
            if (c == 0xC0)
	        goto encoding_error;
            if (cur[1] == 0) {
                xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                cur = ctxt->input->cur;
            }
            if ((cur[1] & 0xc0) != 0x80)
                goto encoding_error;
            if ((c & 0xe0) == 0xe0) {
                unsigned int val;

                if (cur[2] == 0) {
                    xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                    cur = ctxt->input->cur;
                }
                if ((cur[2] & 0xc0) != 0x80)
                    goto encoding_error;
                if ((c & 0xf0) == 0xf0) {
                    if (cur[3] == 0) {
                        xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                        cur = ctxt->input->cur;
                    }
                    if (((c & 0xf8) != 0xf0) ||
                        ((cur[3] & 0xc0) != 0x80))
                        goto encoding_error;
                    /* 4-byte code */
                    ctxt->input->cur += 4;
                    val = (cur[0] & 0x7) << 18;
                    val |= (cur[1] & 0x3f) << 12;
                    val |= (cur[2] & 0x3f) << 6;
                    val |= cur[3] & 0x3f;
                } else {
                    /* 3-byte code */
                    ctxt->input->cur += 3;
                    val = (cur[0] & 0xf) << 12;
                    val |= (cur[1] & 0x3f) << 6;
                    val |= cur[2] & 0x3f;
                }
                if (((val > 0xd7ff) && (val < 0xe000)) ||
                    ((val > 0xfffd) && (val < 0x10000)) ||
                    (val >= 0x110000)) {
		xmlErrEncodingInt(ctxt, XML_ERR_INVALID_CHAR,
				  "Char 0x%X out of allowed range\n",
				  val);
                }
            } else
                /* 2-byte code */
                ctxt->input->cur += 2;
        } else
            /* 1-byte code */
            ctxt->input->cur++;
    } else {
        /*
         * Assume it's a fixed length encoding (1) with
         * a compatible encoding for the ASCII set, since
         * XML constructs only use < 128 chars
         */

        if (*(ctxt->input->cur) == '\n') {
            ctxt->input->line++; ctxt->input->col = 1;
        } else
            ctxt->input->col++;
        ctxt->input->cur++;
    }
    if (*ctxt->input->cur == 0)
        xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
    return;
encoding_error:
    /*
     * If we detect an UTF8 error that probably mean that the
     * input encoding didn't get properly advertised in the
     * declaration header. Report the error and switch the encoding
     * to ISO-Latin-1 (if you don't like this policy, just declare the
     * encoding !)
     */
    if ((ctxt == NULL) || (ctxt->input == NULL) ||
        (ctxt->input->end - ctxt->input->cur < 4)) {
	__xmlErrEncoding(ctxt, XML_ERR_INVALID_CHAR,
		     "Input is not proper UTF-8, indicate encoding !\n",
		     NULL, NULL);
    } else {
        char buffer[150];

	snprintf(buffer, 149, "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
			ctxt->input->cur[0], ctxt->input->cur[1],
			ctxt->input->cur[2], ctxt->input->cur[3]);
	__xmlErrEncoding(ctxt, XML_ERR_INVALID_CHAR,
		     "Input is not proper UTF-8, indicate encoding !\n%s",
		     BAD_CAST buffer, NULL);
    }
    ctxt->charset = XML_CHAR_ENCODING_8859_1;
    ctxt->input->cur++;
    return;
}